

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O2

bool __thiscall
Potassco::ProgramOptions::
OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>::
printOption(OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>
            *this,Option *opt,size_t maxW)

{
  OstreamWriter *this_00;
  vector<char,_std::allocator<char>_> *buf;
  void *pvVar1;
  Value *val;
  DefaultFormat *this_01;
  size_t in_R8;
  
  this_00 = &this->writer_;
  buf = &this->buffer_;
  pvVar1 = (void *)DefaultFormat::format((DefaultFormat *)this,buf,opt,maxW);
  this_01 = (DefaultFormat *)this_00;
  OstreamWriter::write(this_00,(int)buf,pvVar1,maxW);
  val = opt->value_;
  pvVar1 = (void *)DefaultFormat::format(this_01,buf,opt->description_,val,in_R8);
  OstreamWriter::write(this_00,(int)buf,pvVar1,(size_t)val);
  return true;
}

Assistant:

bool printOption(const Option& opt, std::size_t maxW) {
		writer_.write(buffer_, formatter_.format(buffer_, opt, maxW));
		writer_.write(buffer_, formatter_.format(buffer_, opt.description(), *opt.value(), maxW));
		return true;
	}